

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O0

uint32_t net_uv::net_getsockAddrIPAndPort(sockaddr *addr,string *outIP,uint32_t *outPort)

{
  ushort uVar1;
  int iVar2;
  char acStack_c8 [4];
  int32_t r_1;
  char szIp_1 [17];
  sockaddr_in *addr_in_1;
  char acStack_88 [4];
  int32_t r;
  char szIp [47];
  sockaddr_in6 *addr_in;
  uint32_t port;
  uint32_t addrlen;
  string strip;
  uint32_t *outPort_local;
  string *outIP_local;
  sockaddr *addr_local;
  
  if (addr == (sockaddr *)0x0) {
    return 0;
  }
  strip.field_2._8_8_ = outPort;
  std::__cxx11::string::string((string *)&port);
  if (addr->sa_family == 10) {
    addr_in._4_4_ = 0x1c;
    szIp[0x18] = '\0';
    szIp[0x19] = '\0';
    szIp[0x1a] = '\0';
    szIp[0x1b] = '\0';
    szIp[0x1c] = '\0';
    szIp[0x1d] = '\0';
    szIp[0x1e] = '\0';
    szIp[0x1f] = '\0';
    szIp[0x20] = '\0';
    szIp[0x21] = '\0';
    szIp[0x22] = '\0';
    szIp[0x23] = '\0';
    szIp[0x24] = '\0';
    szIp[0x25] = '\0';
    szIp[0x26] = '\0';
    szIp[8] = '\0';
    szIp[9] = '\0';
    szIp[10] = '\0';
    szIp[0xb] = '\0';
    szIp[0xc] = '\0';
    szIp[0xd] = '\0';
    szIp[0xe] = '\0';
    szIp[0xf] = '\0';
    szIp[0x10] = '\0';
    szIp[0x11] = '\0';
    szIp[0x12] = '\0';
    szIp[0x13] = '\0';
    szIp[0x14] = '\0';
    szIp[0x15] = '\0';
    szIp[0x16] = '\0';
    szIp[0x17] = '\0';
    _acStack_88 = 0;
    szIp[0] = '\0';
    szIp[1] = '\0';
    szIp[2] = '\0';
    szIp[3] = '\0';
    szIp[4] = '\0';
    szIp[5] = '\0';
    szIp[6] = '\0';
    szIp[7] = '\0';
    unique0x10000220 = addr;
    iVar2 = uv_ip6_name((sockaddr_in6 *)addr,acStack_88,0x2e);
    if (iVar2 != 0) {
      addr_local._4_4_ = 0;
      goto LAB_001b4e06;
    }
    std::__cxx11::string::operator=((string *)&port,acStack_88);
    uVar1 = ntohs(*(uint16_t *)stack0xffffffffffffffa8->sa_data);
  }
  else {
    addr_in._4_4_ = 0x10;
    _acStack_c8 = 0;
    szIp_1[0] = '\0';
    szIp_1[1] = '\0';
    szIp_1[2] = '\0';
    szIp_1[3] = '\0';
    szIp_1[4] = '\0';
    szIp_1[5] = '\0';
    szIp_1[6] = '\0';
    szIp_1[7] = '\0';
    szIp_1[8] = '\0';
    iVar2 = uv_ip4_name((sockaddr_in *)addr,acStack_c8,0x10);
    if (iVar2 != 0) {
      addr_local._4_4_ = 0;
      goto LAB_001b4e06;
    }
    std::__cxx11::string::operator=((string *)&port,acStack_c8);
    uVar1 = ntohs(*(uint16_t *)addr->sa_data);
  }
  addr_in._0_4_ = (uint)uVar1;
  std::__cxx11::string::operator=((string *)outIP,(string *)&port);
  *(uint *)strip.field_2._8_8_ = (uint)addr_in;
  addr_local._4_4_ = addr_in._4_4_;
LAB_001b4e06:
  std::__cxx11::string::~string((string *)&port);
  return addr_local._4_4_;
}

Assistant:

uint32_t net_getsockAddrIPAndPort(const struct sockaddr* addr, std::string& outIP, uint32_t& outPort)
{
	if (addr == NULL)
		return 0;

	std::string strip;
	uint32_t addrlen = 0;
	uint32_t port = 0;

	if (addr->sa_family == AF_INET6)
	{
		addrlen = sizeof(struct sockaddr_in6);

		const struct sockaddr_in6* addr_in = (const struct sockaddr_in6*) addr;

		char szIp[NET_UV_INET6_ADDRSTRLEN + 1] = { 0 };
		int32_t r = uv_ip6_name(addr_in, szIp, NET_UV_INET6_ADDRSTRLEN);
		if (r != 0)
		{
			return 0;
		}

		strip = szIp;
		port = ntohs(addr_in->sin6_port);
	}
	else
	{
		addrlen = sizeof(struct sockaddr_in);

		const struct sockaddr_in* addr_in = (const struct sockaddr_in*) addr;

		char szIp[NET_UV_INET_ADDRSTRLEN + 1] = { 0 };
		int32_t r = uv_ip4_name(addr_in, szIp, NET_UV_INET_ADDRSTRLEN);
		if (r != 0)
		{
			return 0;
		}

		strip = szIp;
		port = ntohs(addr_in->sin_port);
	}

	outIP = strip;
	outPort = port;

	return addrlen;
}